

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_tb(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uint srcidx;
  TCGv_i64 tcg_dest;
  TCGv_i64 tcg_dest_00;
  TCGv_i64 tcg_dest_01;
  TCGv_i32 arg4;
  TCGv_i32 arg5;
  uintptr_t o_2;
  uintptr_t o;
  uint srcidx_00;
  uintptr_t o_1;
  byte local_58;
  
  if ((insn & 0xc00000) != 0) {
    unallocated_encoding_aarch64(s);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = fp_access_check(s);
  if (!_Var1) {
    return;
  }
  srcidx = insn >> 0x10 & 0x1f;
  srcidx_00 = insn & 0x1f;
  tcg_dest = tcg_temp_new_i64(tcg_ctx);
  tcg_dest_00 = tcg_temp_new_i64(tcg_ctx);
  if ((insn >> 0xc & 1) == 0) {
    tcg_gen_movi_i64_aarch64(tcg_ctx,tcg_dest,0);
    local_58 = (byte)(insn >> 0x1e) & 1;
  }
  else {
    local_58 = 0;
    read_vec_element(s,tcg_dest,srcidx_00,0,MO_64);
    if ((insn >> 0x1e & 1) != 0) {
      read_vec_element(s,tcg_dest_00,srcidx_00,1,MO_64);
      local_58 = 1;
      goto LAB_00638b80;
    }
  }
  tcg_gen_movi_i64_aarch64(tcg_ctx,tcg_dest_00,0);
LAB_00638b80:
  tcg_dest_01 = tcg_temp_new_i64(tcg_ctx);
  arg4 = tcg_const_i32_aarch64(tcg_ctx,insn >> 5 & 0x1f);
  arg5 = tcg_const_i32_aarch64(tcg_ctx,(insn >> 0xd & 3) + 1);
  read_vec_element(s,tcg_dest_01,srcidx,0,MO_64);
  gen_helper_simd_tbl(tcg_ctx,tcg_dest,tcg_ctx->cpu_env,tcg_dest,tcg_dest_01,arg4,arg5);
  if (local_58 != 0) {
    read_vec_element(s,tcg_dest_01,srcidx,1,MO_64);
    gen_helper_simd_tbl(tcg_ctx,tcg_dest_00,tcg_ctx->cpu_env,tcg_dest_00,tcg_dest_01,arg4,arg5);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_01 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg4 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg5 + (long)tcg_ctx));
  write_vec_element(s,tcg_dest,srcidx_00,0,MO_64);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
  write_vec_element(s,tcg_dest_00,srcidx_00,1,MO_64);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_00 + (long)tcg_ctx));
  clear_vec_high(s,true,srcidx_00);
  return;
}

Assistant:

static void disas_simd_tb(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int op2 = extract32(insn, 22, 2);
    int is_q = extract32(insn, 30, 1);
    int rm = extract32(insn, 16, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int is_tblx = extract32(insn, 12, 1);
    int len = extract32(insn, 13, 2);
    TCGv_i64 tcg_resl, tcg_resh, tcg_idx;
    TCGv_i32 tcg_regno, tcg_numregs;

    if (op2 != 0) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* This does a table lookup: for every byte element in the input
     * we index into a table formed from up to four vector registers,
     * and then the output is the result of the lookups. Our helper
     * function does the lookup operation for a single 64 bit part of
     * the input.
     */
    tcg_resl = tcg_temp_new_i64(tcg_ctx);
    tcg_resh = tcg_temp_new_i64(tcg_ctx);

    if (is_tblx) {
        read_vec_element(s, tcg_resl, rd, 0, MO_64);
    } else {
        tcg_gen_movi_i64(tcg_ctx, tcg_resl, 0);
    }
    if (is_tblx && is_q) {
        read_vec_element(s, tcg_resh, rd, 1, MO_64);
    } else {
        tcg_gen_movi_i64(tcg_ctx, tcg_resh, 0);
    }

    tcg_idx = tcg_temp_new_i64(tcg_ctx);
    tcg_regno = tcg_const_i32(tcg_ctx, rn);
    tcg_numregs = tcg_const_i32(tcg_ctx, len + 1);
    read_vec_element(s, tcg_idx, rm, 0, MO_64);
    gen_helper_simd_tbl(tcg_ctx, tcg_resl, tcg_ctx->cpu_env, tcg_resl, tcg_idx,
                        tcg_regno, tcg_numregs);
    if (is_q) {
        read_vec_element(s, tcg_idx, rm, 1, MO_64);
        gen_helper_simd_tbl(tcg_ctx, tcg_resh, tcg_ctx->cpu_env, tcg_resh, tcg_idx,
                            tcg_regno, tcg_numregs);
    }
    tcg_temp_free_i64(tcg_ctx, tcg_idx);
    tcg_temp_free_i32(tcg_ctx, tcg_regno);
    tcg_temp_free_i32(tcg_ctx, tcg_numregs);

    write_vec_element(s, tcg_resl, rd, 0, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resl);
    write_vec_element(s, tcg_resh, rd, 1, MO_64);
    tcg_temp_free_i64(tcg_ctx, tcg_resh);
    clear_vec_high(s, true, rd);
}